

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm_control.c
# Opt level: O1

void INT_CMCondition_fail(CManager cm,int condition)

{
  CMControlList p_Var1;
  CMControlList cl;
  CMControlList extraout_RDX;
  CMCondition cond;
  
  cl = (CMControlList)(ulong)(uint)condition;
  p_Var1 = cm->control_list;
  cond = (CMCondition)&p_Var1->condition_list;
  do {
    cond = cond->next;
    if (cond == (CMCondition)0x0) {
      cond = (CMCondition)0x0;
      fprintf(_stderr,"Serious internal error.  Use of condition %d, no longer in control list\n");
      cl = extraout_RDX;
      break;
    }
  } while (cond->condition_num != condition);
  if (cond != (CMCondition)0x0) {
    cond->failed = 1;
    CMCondition_trigger(cm,cond,cl);
    if (p_Var1->cond_polling != 0) {
      CMwake_server_thread(cm);
      return;
    }
  }
  return;
}

Assistant:

extern void
INT_CMCondition_fail(CManager cm, int condition)
{
    CMControlList cl = cm->control_list;
    CMCondition cond = CMCondition_find(cl, condition);
    if (!cond) return;
    cond->failed = 1;
    CMCondition_trigger(cm, cond, cm->control_list);

    if (cl->cond_polling) {
	/* wake the server thread in case we're not him */
	CMwake_server_thread(cm);
    }
}